

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall cmInstallExportGenerator::ComputeTempDir(cmInstallExportGenerator *this)

{
  string local_30;
  cmInstallExportGenerator *local_10;
  cmInstallExportGenerator *this_local;
  
  local_10 = this;
  TempDirCalculate_abi_cxx11_(&local_30,this);
  std::__cxx11::string::operator=((string *)&this->TempDir,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void cmInstallExportGenerator::ComputeTempDir()
{
  this->TempDir = this->TempDirCalculate();
}